

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  byte bVar1;
  
  for (; (bVar1 = *(byte *)&this->field_0 & 0xf, bVar1 == 8 || (bVar1 == 9));
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8)) {
  }
  if (bVar1 == 0xc) {
    return true;
  }
  return false;
}

Assistant:

bool is_byte_string() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_byte_string();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_byte_string();
                default:
                    return false;
            }
        }